

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::EnhancedLayouts::VaryingLocationLimitTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,VaryingLocationLimitTest *this,GLuint test_case_index,
          STAGES stage)

{
  Type *type;
  bool bVar1;
  pointer ptVar2;
  uint uVar3;
  TestError *pTVar4;
  char *pcVar5;
  bool *text;
  bool *text_00;
  bool *text_01;
  GLchar *text_02;
  size_t position;
  GLchar buffer [16];
  size_t local_68;
  char *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  GLchar *local_50;
  char local_48 [24];
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptVar2[test_case_index].m_stage != stage) {
    if (stage - VERTEX < 5) {
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)0x0,
                 (ulong)(&PTR_anon_var_dwarf_192842_02117fb8)[stage - VERTEX]);
      return __return_storage_ptr__;
    }
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x38cc);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  ptVar2 = ptVar2 + test_case_index;
  type = &ptVar2->m_type;
  uVar3 = TestBase::getLastInputLocation((TestBase *)this,stage,type,0);
  local_68 = 0;
  local_50 = Utils::Type::GetGLSLTypeName(type);
  bVar1 = ptVar2->m_is_input;
  if (bVar1 == false) {
    uVar3 = TestBase::getLastOutputLocation((TestBase *)this,stage,type,0);
    local_60 = 
    "    gokuINDEX = TYPE(0);\n    if (vec4(0) == result)\n    {\n        gokuINDEX = TYPE(1);\n    }\n"
    ;
    text_02 = "out";
  }
  else {
    local_60 = 
    "    if (TYPE(0) == gokuINDEX)\n    {\n        result += vec4(1, 0.5, 0.25, 0.125);\n    }\n";
    text_02 = "in ";
  }
  if (type->m_basic_type == Float) {
    text_00 = glcts::fixed_sample_locations_values + 1;
  }
  else {
    text_00 = (bool *)0x1a55ca0;
    if ((stage == FRAGMENT & bVar1) == 0) {
      if (bVar1 != false) {
        text_00 = glcts::fixed_sample_locations_values + 1;
      }
      if (stage != FRAGMENT) {
        text_00 = glcts::fixed_sample_locations_values + 1;
      }
    }
  }
  sprintf(local_48,"%d",(ulong)uVar3);
  switch(stage) {
  case VERTEX:
    pcVar5 = 
    "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nVAR_DEFINITION\nin  vec4 in_vs;\nout vec4 vs_tcs;\n\nvoid main()\n{\n    vec4 result = in_vs;\n\nVARIABLE_USE\n    vs_tcs += result;\n}\n\n"
    ;
    break;
  case TESS_CTRL:
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x1a5812c);
    text = (bool *)0x1ac6dac;
    text_01 = (bool *)0x1ac6dfc;
    goto LAB_008a9727;
  case TESS_EVAL:
    pcVar5 = 
    "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nlayout(isolines, point_mode) in;\n\nVAR_DEFINITION\nin  vec4 tcs_tes[];\nout vec4 tes_gs;\n\nvoid main()\n{\n    vec4 result = tcs_tes[0];\n\nVARIABLE_USE\n    tes_gs += result;\n}\n\n"
    ;
    goto LAB_008a96e0;
  case GEOMETRY:
    pcVar5 = 
    "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nVAR_DEFINITION\nin  vec4 tes_gs[];\nout vec4 gs_fs;\n\nvoid main()\n{\n    vec4 result = tes_gs[0];\n\nVARIABLE_USE\n    gs_fs = result;\n    gl_Position  = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    gs_fs = result;\n    gl_Position  = vec4(-1, 1, 0, 1);\n    EmitVertex();\n    gs_fs = result;\n    gl_Position  = vec4(1, -1, 0, 1);\n    EmitVertex();\n    gs_fs = result;\n    gl_Position  = vec4(1, 1, 0, 1);\n    EmitVertex();\n}\n\n"
    ;
LAB_008a96e0:
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)pcVar5);
    text = (bool *)0x1ac6dac;
    text_01 = (bool *)0x1a656ec;
    goto LAB_008a9727;
  case FRAGMENT:
    pcVar5 = 
    "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nVAR_DEFINITION\nin  vec4 gs_fs;\nout vec4 fs_out;\n\nvoid main()\n{\n    vec4 result = gs_fs;\n\nVARIABLE_USE\n    fs_out += result;\n}\n\n"
    ;
    break;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x38a9);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar5);
  text_01 = glcts::fixed_sample_locations_values + 1;
  text = glcts::fixed_sample_locations_values + 1;
LAB_008a9727:
  Utils::replaceToken("VAR_DEFINITION",&local_68,
                      "layout (location = LAST + 1) FLAT DIRECTION TYPE gokuARRAY;\n",
                      __return_storage_ptr__);
  local_68 = 0;
  Utils::replaceToken("LAST",&local_68,local_48,__return_storage_ptr__);
  Utils::replaceToken("FLAT",&local_68,text_00,__return_storage_ptr__);
  Utils::replaceToken("DIRECTION",&local_68,text_02,__return_storage_ptr__);
  Utils::replaceToken("ARRAY",&local_68,text,__return_storage_ptr__);
  Utils::replaceToken("VARIABLE_USE",&local_68,local_60,__return_storage_ptr__);
  Utils::replaceAllTokens("TYPE",local_50,__return_storage_ptr__);
  Utils::replaceAllTokens("INDEX",text_01,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingLocationLimitTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	static const GLchar* var_definition = "layout (location = LAST + 1) FLAT DIRECTION TYPE gokuARRAY;\n";
	static const GLchar* input_use		= "    if (TYPE(0) == gokuINDEX)\n"
									 "    {\n"
									 "        result += vec4(1, 0.5, 0.25, 0.125);\n"
									 "    }\n";
	static const GLchar* output_use = "    gokuINDEX = TYPE(0);\n"
									  "    if (vec4(0) == result)\n"
									  "    {\n"
									  "        gokuINDEX = TYPE(1);\n"
									  "    }\n";
	static const GLchar* fs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 gs_fs;\n"
							  "out vec4 fs_out;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    fs_out = gs_fs;\n"
							  "}\n"
							  "\n";
	static const GLchar* fs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 gs_fs;\n"
									 "out vec4 fs_out;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = gs_fs;\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    fs_out += result;\n"
									 "}\n"
									 "\n";
	static const GLchar* gs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "layout(points)                           in;\n"
							  "layout(triangle_strip, max_vertices = 4) out;\n"
							  "\n"
							  "in  vec4 tes_gs[];\n"
							  "out vec4 gs_fs;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    gs_fs = tes_gs[0];\n"
							  "    gl_Position  = vec4(-1, -1, 0, 1);\n"
							  "    EmitVertex();\n"
							  "    gs_fs = tes_gs[0];\n"
							  "    gl_Position  = vec4(-1, 1, 0, 1);\n"
							  "    EmitVertex();\n"
							  "    gs_fs = tes_gs[0];\n"
							  "    gl_Position  = vec4(1, -1, 0, 1);\n"
							  "    EmitVertex();\n"
							  "    gs_fs = tes_gs[0];\n"
							  "    gl_Position  = vec4(1, 1, 0, 1);\n"
							  "    EmitVertex();\n"
							  "}\n"
							  "\n";
	static const GLchar* gs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "layout(points)                           in;\n"
									 "layout(triangle_strip, max_vertices = 4) out;\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 tes_gs[];\n"
									 "out vec4 gs_fs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = tes_gs[0];\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "}\n"
									 "\n";
	static const GLchar* tcs = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(vertices = 1) out;\n"
							   "\n"
							   "in  vec4 vs_tcs[];\n"
							   "out vec4 tcs_tes[];\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "\n"
							   "    tcs_tes[gl_InvocationID] = vs_tcs[gl_InvocationID];\n"
							   "\n"
							   "    gl_TessLevelOuter[0] = 1.0;\n"
							   "    gl_TessLevelOuter[1] = 1.0;\n"
							   "    gl_TessLevelOuter[2] = 1.0;\n"
							   "    gl_TessLevelOuter[3] = 1.0;\n"
							   "    gl_TessLevelInner[0] = 1.0;\n"
							   "    gl_TessLevelInner[1] = 1.0;\n"
							   "}\n"
							   "\n";
	static const GLchar* tcs_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(vertices = 1) out;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 vs_tcs[];\n"
									  "out vec4 tcs_tes[];\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = vs_tcs[gl_InvocationID];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tcs_tes[gl_InvocationID] = result;\n"
									  "\n"
									  "    gl_TessLevelOuter[0] = 1.0;\n"
									  "    gl_TessLevelOuter[1] = 1.0;\n"
									  "    gl_TessLevelOuter[2] = 1.0;\n"
									  "    gl_TessLevelOuter[3] = 1.0;\n"
									  "    gl_TessLevelInner[0] = 1.0;\n"
									  "    gl_TessLevelInner[1] = 1.0;\n"
									  "}\n"
									  "\n";
	static const GLchar* tes = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(isolines, point_mode) in;\n"
							   "\n"
							   "in  vec4 tcs_tes[];\n"
							   "out vec4 tes_gs;\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "    tes_gs = tcs_tes[0];\n"
							   "}\n"
							   "\n";
	static const GLchar* tes_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(isolines, point_mode) in;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 tcs_tes[];\n"
									  "out vec4 tes_gs;\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = tcs_tes[0];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tes_gs += result;\n"
									  "}\n"
									  "\n";
	static const GLchar* vs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 in_vs;\n"
							  "out vec4 vs_tcs;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    vs_tcs = in_vs;\n"
							  "}\n"
							  "\n";
	static const GLchar* vs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 in_vs;\n"
									 "out vec4 vs_tcs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = in_vs;\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    vs_tcs += result;\n"
									 "}\n"
									 "\n";

	std::string source;
	testCase&   test_case = m_test_cases[test_case_index];

	if (test_case.m_stage == stage)
	{
		const GLchar*			 array = "";
		GLchar					 buffer[16];
		const GLchar*			 direction = "in ";
		const GLchar*			 flat	  = "";
		const GLchar*			 index	 = "";
		GLuint					 last	  = getLastInputLocation(stage, test_case.m_type, 0);
		size_t					 position  = 0;
		size_t					 temp;
		const GLchar*			 type_name = test_case.m_type.GetGLSLTypeName();
		Utils::Variable::STORAGE storage   = Utils::Variable::VARYING_INPUT;
		const GLchar*			 var_use   = input_use;

		if (false == test_case.m_is_input)
		{
			direction = "out";
			last	  = getLastOutputLocation(stage, test_case.m_type, 0);
			storage   = Utils::Variable::VARYING_OUTPUT;
			var_use   = output_use;
		}

		if (true == isFlatRequired(stage, test_case.m_type, storage))
		{
			flat = "flat";
		}

		sprintf(buffer, "%d", last);

		switch (stage)
		{
		case Utils::Shader::FRAGMENT:
			source = fs_tested;
			break;
		case Utils::Shader::GEOMETRY:
			source = gs_tested;
			array  = "[]";
			index  = "[0]";
			break;
		case Utils::Shader::TESS_CTRL:
			source = tcs_tested;
			array  = "[]";
			index  = "[gl_InvocationID]";
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes_tested;
			array  = "[]";
			index  = "[0]";
			break;
		case Utils::Shader::VERTEX:
			source = vs_tested;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		temp = position;
		Utils::replaceToken("VAR_DEFINITION", position, var_definition, source);
		position = temp;
		Utils::replaceToken("LAST", position, buffer, source);
		Utils::replaceToken("FLAT", position, flat, source);
		Utils::replaceToken("DIRECTION", position, direction, source);
		Utils::replaceToken("ARRAY", position, array, source);
		Utils::replaceToken("VARIABLE_USE", position, var_use, source);

		Utils::replaceAllTokens("TYPE", type_name, source);
		Utils::replaceAllTokens("INDEX", index, source);
	}
	else
	{
		switch (stage)
		{
		case Utils::Shader::FRAGMENT:
			source = fs;
			break;
		case Utils::Shader::GEOMETRY:
			source = gs;
			break;
		case Utils::Shader::TESS_CTRL:
			source = tcs;
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes;
			break;
		case Utils::Shader::VERTEX:
			source = vs;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}
	}

	return source;
}